

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzerSettings.cpp
# Opt level: O1

void __thiscall
EnrichableI2cAnalyzerSettings::LoadSettings(EnrichableI2cAnalyzerSettings *this,char *settings)

{
  int iVar1;
  SimpleArchive text_archive;
  char *name_string;
  SimpleArchive aSStack_28 [8];
  char *local_20;
  
  SimpleArchive::SimpleArchive(aSStack_28);
  SimpleArchive::SetString((char *)aSStack_28);
  SimpleArchive::operator>>(aSStack_28,&local_20);
  iVar1 = strcmp(local_20,"SaleaeEnrichableI2CAnalyzer");
  if (iVar1 != 0) {
    AnalyzerHelpers::Assert
              (
              "SaleaeEnrichableI2CAnalyzer: Provided with a settings string that doesn\'t belong to us;"
              );
  }
  SimpleArchive::operator>>(aSStack_28,&this->mSdaChannel);
  SimpleArchive::operator>>(aSStack_28,&this->mSclChannel);
  SimpleArchive::operator>>(aSStack_28,&this->mAddressDisplay);
  SimpleArchive::operator>>(aSStack_28,&this->mParserCommand);
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSdaChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSclChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(aSStack_28);
  return;
}

Assistant:

void EnrichableI2cAnalyzerSettings::LoadSettings( const char* settings )
{
	SimpleArchive text_archive;
	text_archive.SetString( settings );

	const char* name_string;	//the first thing in the archive is the name of the protocol analyzer that the data belongs to.
	text_archive >> &name_string;
	if( strcmp( name_string, "SaleaeEnrichableI2CAnalyzer" ) != 0 )
		AnalyzerHelpers::Assert( "SaleaeEnrichableI2CAnalyzer: Provided with a settings string that doesn't belong to us;" );

	text_archive >> mSdaChannel;
	text_archive >> mSclChannel;
	text_archive >> *(U32*)&mAddressDisplay;
	text_archive >>  &mParserCommand;

	ClearChannels();
	AddChannel( mSdaChannel, "SDA", true );
	AddChannel( mSclChannel, "SCL", true );

	UpdateInterfacesFromSettings();
}